

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

int ecp_mod_p256(mbedtls_mpi *N)

{
  char cVar1;
  uint local_54;
  size_t bits;
  size_t i;
  char local_16;
  char local_15;
  uint32_t cur;
  char cc;
  char c;
  mbedtls_mpi *pmStack_10;
  int ret;
  mbedtls_mpi *N_local;
  
  cur = 0xffffff92;
  local_15 = '\0';
  pmStack_10 = N;
  cur = mbedtls_mpi_grow(N,9);
  if (cur == 0) {
    i._4_4_ = (uint)*pmStack_10->p;
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[4],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[4] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[5] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[7],&local_15);
    cVar1 = local_15;
    *pmStack_10->p = *pmStack_10->p & 0xffffffff00000000;
    *pmStack_10->p = (ulong)i._4_4_ | *pmStack_10->p;
    i._4_4_ = (uint)(*pmStack_10->p >> 0x20);
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[4] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[5],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[7],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[7] >> 0x20),&local_15);
    cVar1 = local_15;
    *pmStack_10->p = *pmStack_10->p & 0xffffffff;
    *pmStack_10->p = (ulong)i._4_4_ << 0x20 | *pmStack_10->p;
    i._4_4_ = (uint)pmStack_10->p[1];
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[5],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[5] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[7],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[7] >> 0x20),&local_15);
    cVar1 = local_15;
    pmStack_10->p[1] = pmStack_10->p[1] & 0xffffffff00000000;
    pmStack_10->p[1] = (ulong)i._4_4_ | pmStack_10->p[1];
    i._4_4_ = (uint)(pmStack_10->p[1] >> 0x20);
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[5] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[5] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[7] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[4],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[4] >> 0x20),&local_15);
    cVar1 = local_15;
    pmStack_10->p[1] = pmStack_10->p[1] & 0xffffffff;
    pmStack_10->p[1] = (ulong)i._4_4_ << 0x20 | pmStack_10->p[1];
    i._4_4_ = (uint)pmStack_10->p[2];
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[7],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[4] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[5],&local_15);
    cVar1 = local_15;
    pmStack_10->p[2] = pmStack_10->p[2] & 0xffffffff00000000;
    pmStack_10->p[2] = (ulong)i._4_4_ | pmStack_10->p[2];
    i._4_4_ = (uint)(pmStack_10->p[2] >> 0x20);
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[7],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[7],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[7] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[5],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[5] >> 0x20),&local_15);
    cVar1 = local_15;
    pmStack_10->p[2] = pmStack_10->p[2] & 0xffffffff;
    pmStack_10->p[2] = (ulong)i._4_4_ << 0x20 | pmStack_10->p[2];
    i._4_4_ = (uint)pmStack_10->p[3];
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[7],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[7],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[7] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[7] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[7],&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[4],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[4] >> 0x20),&local_15);
    cVar1 = local_15;
    pmStack_10->p[3] = pmStack_10->p[3] & 0xffffffff00000000;
    pmStack_10->p[3] = (ulong)i._4_4_ | pmStack_10->p[3];
    i._4_4_ = (uint)(pmStack_10->p[3] >> 0x20);
    local_16 = local_15;
    local_15 = '\0';
    if (cVar1 < '\0') {
      sub32((uint32_t *)((long)&i + 4),-(int)cVar1,&local_15);
    }
    else {
      add32((uint32_t *)((long)&i + 4),(int)cVar1,&local_15);
    }
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[7] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[7] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[7] >> 0x20),&local_15);
    add32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[4],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[5],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[5] >> 0x20),&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)pmStack_10->p[6],&local_15);
    sub32((uint32_t *)((long)&i + 4),(uint32_t)(pmStack_10->p[6] >> 0x20),&local_15);
    pmStack_10->p[3] = pmStack_10->p[3] & 0xffffffff;
    pmStack_10->p[3] = (ulong)i._4_4_ << 0x20 | pmStack_10->p[3];
    bits = 8;
    if (local_15 < '\x01') {
      local_54 = 0;
    }
    else {
      local_54 = (uint)local_15;
    }
    pmStack_10->p[4] = pmStack_10->p[4] & 0xffffffff00000000;
    pmStack_10->p[4] = (ulong)local_54 | pmStack_10->p[4];
    i._4_4_ = 0;
    while (bits = bits + 1, bits < (ulong)(long)(int)((uint)pmStack_10->n << 1)) {
      if ((bits & 1) == 0) {
        pmStack_10->p[bits >> 1] = pmStack_10->p[bits >> 1] & 0xffffffff00000000;
        pmStack_10->p[bits >> 1] = pmStack_10->p[bits >> 1];
      }
      else {
        pmStack_10->p[bits >> 1] = pmStack_10->p[bits >> 1] & 0xffffffff;
        pmStack_10->p[bits >> 1] = pmStack_10->p[bits >> 1];
      }
    }
    if (local_15 < '\0') {
      mbedtls_ecp_fix_negative(pmStack_10,local_15,0x100);
    }
  }
  return cur;
}

Assistant:

static int ecp_mod_p256(mbedtls_mpi *N)
{
    INIT(256);

    ADD(8); ADD(9);
    SUB(11); SUB(12); SUB(13); SUB(14);             NEXT;         // A0

    ADD(9); ADD(10);
    SUB(12); SUB(13); SUB(14); SUB(15);             NEXT;         // A1

    ADD(10); ADD(11);
    SUB(13); SUB(14); SUB(15);                        NEXT;       // A2

    ADD(11); ADD(11); ADD(12); ADD(12); ADD(13);
    SUB(15); SUB(8); SUB(9);                        NEXT;         // A3

    ADD(12); ADD(12); ADD(13); ADD(13); ADD(14);
    SUB(9); SUB(10);                                   NEXT;      // A4

    ADD(13); ADD(13); ADD(14); ADD(14); ADD(15);
    SUB(10); SUB(11);                                   NEXT;     // A5

    ADD(14); ADD(14); ADD(15); ADD(15); ADD(14); ADD(13);
    SUB(8); SUB(9);                                   NEXT;       // A6

    ADD(15); ADD(15); ADD(15); ADD(8);
    SUB(10); SUB(11); SUB(12); SUB(13);             LAST;         // A7

cleanup:
    return ret;
}